

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::testCompressedFormatsSupported
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  int iVar2;
  TestLog *pTVar3;
  char *__s;
  char *__s_00;
  VkFormat *pVVar4;
  int iVar5;
  bool bVar6;
  VkPhysicalDeviceFeatures *pVVar7;
  size_t sVar8;
  long lVar9;
  VkFormat *pVVar10;
  bool bVar11;
  int local_1ec;
  int local_1e0;
  int local_1dc;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  pTVar3 = context->m_testCtx->m_log;
  pVVar7 = Context::getDeviceFeatures(context);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  lVar9 = 0;
  local_1dc = 0;
  local_1ec = 0;
  local_1e0 = 0;
  do {
    __s = testCompressedFormatsSupported::s_compressedFormatSets[lVar9].setName;
    __s_00 = testCompressedFormatsSupported::s_compressedFormatSets[lVar9].featureName;
    iVar2 = *(int *)((long)&pVVar7->robustBufferAccess +
                    testCompressedFormatsSupported::s_compressedFormatSets[lVar9].feature);
    pVVar10 = testCompressedFormatsSupported::s_compressedFormatSets[lVar9].formatsBegin;
    pVVar4 = testCompressedFormatsSupported::s_compressedFormatSets[lVar9].formatsEnd;
    bVar11 = pVVar10 == pVVar4;
    if ((!bVar11) && (bVar6 = optimalTilingFeaturesSupported(context,*pVVar10,1), bVar6)) {
      do {
        pVVar10 = pVVar10 + 1;
        bVar11 = pVVar10 == pVVar4;
        if (bVar11) break;
        bVar6 = optimalTilingFeaturesSupported(context,*pVVar10,1);
      } while (bVar6);
    }
    iVar5 = (int)poVar1;
    local_1b0._0_8_ = pTVar3;
    if ((bool)(iVar2 != 1 | bVar11)) {
      if ((bool)(bVar11 & iVar2 != 1)) {
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"WARNING: ",9);
        if (__s == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(local_1b0._8_8_ + -0x18) + iVar5);
        }
        else {
          sVar8 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," formats supported but ",0x17);
        if (__s_00 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(local_1b0._8_8_ + -0x18) + iVar5);
        }
        else {
          sVar8 = strlen(__s_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s_00,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = VK_FALSE",0xb);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        local_1e0 = local_1e0 + 1;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ERROR: ",7);
      if (__s_00 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(local_1b0._8_8_ + -0x18) + iVar5);
      }
      else {
        sVar8 = strlen(__s_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s_00,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," = VK_TRUE but ",0xf);
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(local_1b0._8_8_ + -0x18) + iVar5);
      }
      else {
        sVar8 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," formats not supported",0x16);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      local_1ec = local_1ec + 1;
    }
    if (iVar2 == 1) {
      local_1b0._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"All ",4);
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(local_1b0._8_8_ + -0x18) + iVar5);
      }
      else {
        sVar8 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," formats are supported",0x16);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      local_1dc = local_1dc + 1;
    }
    else {
      local_1b0._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(local_1b0._8_8_ + -0x18) + iVar5);
      }
      else {
        sVar8 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," formats are not supported",0x1a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
    }
    lVar9 = lVar9 + 1;
    if (lVar9 == 3) {
      if (local_1dc == 0) {
        poVar1 = (ostringstream *)(local_1b0 + 8);
        local_1b0._0_8_ = pTVar3;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"No compressed format sets supported",0x23);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        local_1ec = local_1ec + 1;
      }
      if (local_1ec < 1) {
        if (local_1e0 < 1) {
          local_1b0._0_8_ = local_1a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,"Compressed texture format support is valid","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_1b0._0_8_,
                     (long)(qpTestLog **)local_1b0._0_8_ + local_1b0._8_8_);
        }
        else {
          local_1b0._0_8_ = local_1a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,"Found inconsistencies in compressed format support","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_1b0._0_8_,
                     (long)(qpTestLog **)local_1b0._0_8_ + local_1b0._8_8_);
        }
      }
      else {
        local_1b0._0_8_ = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"Compressed format support not valid","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,local_1b0._0_8_,
                   (long)(qpTestLog **)local_1b0._0_8_ + local_1b0._8_8_);
      }
      if ((TestLog *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

tcu::TestStatus testCompressedFormatsSupported (Context& context)
{
	static const VkFormat s_allBcFormats[] =
	{
		VK_FORMAT_BC1_RGB_UNORM_BLOCK,
		VK_FORMAT_BC1_RGB_SRGB_BLOCK,
		VK_FORMAT_BC1_RGBA_UNORM_BLOCK,
		VK_FORMAT_BC1_RGBA_SRGB_BLOCK,
		VK_FORMAT_BC2_UNORM_BLOCK,
		VK_FORMAT_BC2_SRGB_BLOCK,
		VK_FORMAT_BC3_UNORM_BLOCK,
		VK_FORMAT_BC3_SRGB_BLOCK,
		VK_FORMAT_BC4_UNORM_BLOCK,
		VK_FORMAT_BC4_SNORM_BLOCK,
		VK_FORMAT_BC5_UNORM_BLOCK,
		VK_FORMAT_BC5_SNORM_BLOCK,
		VK_FORMAT_BC6H_UFLOAT_BLOCK,
		VK_FORMAT_BC6H_SFLOAT_BLOCK,
		VK_FORMAT_BC7_UNORM_BLOCK,
		VK_FORMAT_BC7_SRGB_BLOCK,
	};
	static const VkFormat s_allEtc2Formats[] =
	{
		VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK,
		VK_FORMAT_EAC_R11_UNORM_BLOCK,
		VK_FORMAT_EAC_R11_SNORM_BLOCK,
		VK_FORMAT_EAC_R11G11_UNORM_BLOCK,
		VK_FORMAT_EAC_R11G11_SNORM_BLOCK,
	};
	static const VkFormat s_allAstcLdrFormats[] =
	{
		VK_FORMAT_ASTC_4x4_UNORM_BLOCK,
		VK_FORMAT_ASTC_4x4_SRGB_BLOCK,
		VK_FORMAT_ASTC_5x4_UNORM_BLOCK,
		VK_FORMAT_ASTC_5x4_SRGB_BLOCK,
		VK_FORMAT_ASTC_5x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_5x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_6x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_6x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_6x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_6x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x8_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x8_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x8_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x8_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x10_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x10_SRGB_BLOCK,
		VK_FORMAT_ASTC_12x10_UNORM_BLOCK,
		VK_FORMAT_ASTC_12x10_SRGB_BLOCK,
		VK_FORMAT_ASTC_12x12_UNORM_BLOCK,
		VK_FORMAT_ASTC_12x12_SRGB_BLOCK,
	};

	static const struct
	{
		const char*									setName;
		const char*									featureName;
		const VkBool32 VkPhysicalDeviceFeatures::*	feature;
		const VkFormat*								formatsBegin;
		const VkFormat*								formatsEnd;
	} s_compressedFormatSets[] =
	{
		{ "BC",			"textureCompressionBC",			&VkPhysicalDeviceFeatures::textureCompressionBC,		DE_ARRAY_BEGIN(s_allBcFormats),			DE_ARRAY_END(s_allBcFormats)		},
		{ "ETC2",		"textureCompressionETC2",		&VkPhysicalDeviceFeatures::textureCompressionETC2,		DE_ARRAY_BEGIN(s_allEtc2Formats),		DE_ARRAY_END(s_allEtc2Formats)		},
		{ "ASTC LDR",	"textureCompressionASTC_LDR",	&VkPhysicalDeviceFeatures::textureCompressionASTC_LDR,	DE_ARRAY_BEGIN(s_allAstcLdrFormats),	DE_ARRAY_END(s_allAstcLdrFormats)	},
	};

	TestLog&						log					= context.getTestContext().getLog();
	const VkPhysicalDeviceFeatures&	features			= context.getDeviceFeatures();
	int								numSupportedSets	= 0;
	int								numErrors			= 0;
	int								numWarnings			= 0;

	for (int setNdx = 0; setNdx < DE_LENGTH_OF_ARRAY(s_compressedFormatSets); ++setNdx)
	{
		const char* const	setName			= s_compressedFormatSets[setNdx].setName;
		const char* const	featureName		= s_compressedFormatSets[setNdx].featureName;
		const bool			featureBitSet	= features.*s_compressedFormatSets[setNdx].feature == VK_TRUE;
		const bool			allSupported	= optimalTilingFeaturesSupportedForAll(context,
																				   s_compressedFormatSets[setNdx].formatsBegin,
																				   s_compressedFormatSets[setNdx].formatsEnd,
																				   VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT);

		if (featureBitSet && !allSupported)
		{
			log << TestLog::Message << "ERROR: " << featureName << " = VK_TRUE but " << setName << " formats not supported" << TestLog::EndMessage;
			numErrors += 1;
		}
		else if (allSupported && !featureBitSet)
		{
			log << TestLog::Message << "WARNING: " << setName << " formats supported but " << featureName << " = VK_FALSE" << TestLog::EndMessage;
			numWarnings += 1;
		}

		if (featureBitSet)
		{
			log << TestLog::Message << "All " << setName << " formats are supported" << TestLog::EndMessage;
			numSupportedSets += 1;
		}
		else
			log << TestLog::Message << setName << " formats are not supported" << TestLog::EndMessage;
	}

	if (numSupportedSets == 0)
	{
		log << TestLog::Message << "No compressed format sets supported" << TestLog::EndMessage;
		numErrors += 1;
	}

	if (numErrors > 0)
		return tcu::TestStatus::fail("Compressed format support not valid");
	else if (numWarnings > 0)
		return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Found inconsistencies in compressed format support");
	else
		return tcu::TestStatus::pass("Compressed texture format support is valid");
}